

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O1

hwaddr ppc_hash64_get_phys_page_debug(PowerPCCPU_conflict3 *cpu,target_ulong addr)

{
  int iVar1;
  ppc_slb_t *slb;
  hwaddr hVar2;
  ulong uVar3;
  uint apshift;
  ppc_hash_pte64_t pte;
  ppc_slb_t vrma_slbe;
  uint local_44;
  ppc_hash_pte64_t local_40;
  ppc_slb_t local_30;
  
  uVar3 = (cpu->env).msr;
  if ((uVar3 & 0x10) != 0) {
    slb = slb_lookup(cpu,addr);
    if (slb == (ppc_slb_t *)0x0) {
      return 0xffffffffffffffff;
    }
    goto LAB_00b69aff;
  }
  if ((uVar3 & 0x1000000000000000) == 0) {
    if ((-1 < (long)addr) && ((cpu->env).has_hv_mode == false)) goto LAB_00b69b7b;
  }
  else if (-1 < (long)addr) {
LAB_00b69b7b:
    uVar3 = (cpu->env).spr[0x139];
    goto LAB_00b69b82;
  }
  if (((cpu->env).mmu_model == POWERPC_MMU_3_00) || ((long)(cpu->env).spr[0x13e] < 0)) {
    slb = &local_30;
    iVar1 = build_vrma_slbe(cpu,slb);
    if (iVar1 != 0) {
      return 0xffffffffffffffff;
    }
LAB_00b69aff:
    hVar2 = ppc_hash64_htab_lookup(cpu,slb,addr,&local_40,&local_44);
    if (hVar2 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    if (0x3f < local_44 - 1) {
      __assert_fail("start >= 0 && length > 0 && length <= 64 - start",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                    ,0x1bd,"uint64_t deposit64(uint64_t, int, int, uint64_t)");
    }
    uVar3 = 0xffffffffffffffff >> (-(char)local_44 & 0x3fU);
    return addr & uVar3 & 0xfffffffffffff000 | ~uVar3 & local_40.pte1 & 0xffffffffffff000;
  }
  if (*(ulong *)(rmls_limit_rma_sizes + ((uint)(cpu->env).spr[0x13e] >> 0x17 & 0x78)) <=
      (addr & 0xfffffffffffffff)) {
    return 0xffffffffffffffff;
  }
  uVar3 = (cpu->env).spr[0x138];
LAB_00b69b82:
  return addr & 0xfffffffffffffff | uVar3;
}

Assistant:

hwaddr ppc_hash64_get_phys_page_debug(PowerPCCPU *cpu, target_ulong addr)
{
    CPUPPCState *env = &cpu->env;
    ppc_slb_t vrma_slbe;
    ppc_slb_t *slb;
    hwaddr ptex, raddr;
    ppc_hash_pte64_t pte;
    unsigned apshift;

    /* Handle real mode */
    if (msr_dr == 0) {
        /* In real mode the top 4 effective address bits are ignored */
        raddr = addr & 0x0FFFFFFFFFFFFFFFULL;

#if 0
        if (cpu->vhyp) {
            /*
             * In virtual hypervisor mode, there's nothing to do:
             *   EA == GPA == qemu guest address
             */
            return raddr;
        } else
#endif
        if ((msr_hv || !env->has_hv_mode) && !(addr >> 63)) {
            /* In HV mode, add HRMOR if top EA bit is clear */
            return raddr | env->spr[SPR_HRMOR];
        } else if (ppc_hash64_use_vrma(env)) {
            /* Emulated VRMA mode */
            slb = &vrma_slbe;
            if (build_vrma_slbe(cpu, slb) != 0) {
                return -1;
            }
        } else {
            target_ulong limit = rmls_limit(cpu);

            /* Emulated old-style RMO mode, bounds check against RMLS */
            if (raddr >= limit) {
                return -1;
            }
            return raddr | env->spr[SPR_RMOR];
        }
    } else {
        slb = slb_lookup(cpu, addr);
        if (!slb) {
            return -1;
        }
    }

    ptex = ppc_hash64_htab_lookup(cpu, slb, addr, &pte, &apshift);
    if (ptex == -1) {
        return -1;
    }

    return deposit64(pte.pte1 & HPTE64_R_RPN, 0, apshift, addr)
        & TARGET_PAGE_MASK;
}